

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

void invocation_message(void)

{
  xchar xVar1;
  xchar xVar2;
  boolean bVar3;
  int iVar4;
  obj *obj;
  char *pcVar5;
  char *pcVar6;
  char *__format;
  char buf [256];
  char local_138 [264];
  
  bVar3 = Invocation_lev(&u.uz);
  if (bVar3 == '\0') {
    return;
  }
  iVar4 = dist2((int)inv_pos.x,(int)inv_pos.y,(int)u.ux,(int)u.uy);
  pcVar5 = "faint trembling";
  if (iVar4 < 3) {
    pcVar5 = "weak trembling";
  }
  pcVar6 = "strange vibration";
  if (iVar4 != 0) {
    pcVar6 = pcVar5;
  }
  if (4 < iVar4) {
    return;
  }
  bVar3 = On_stairs(inv_pos.x,inv_pos.y);
  if (bVar3 != '\0') {
    return;
  }
  obj = carrying(0x10b);
  if (-1 < multi) {
    u._1052_1_ = u._1052_1_ & 0xef;
    u.usleep = 0;
    multi = 0;
    memset(multi_txt,0,0x100);
    flags.run = 0;
    flags.mv = '\0';
    iflags.travel1 = '\0';
    flags.travel = '\0';
  }
  if (u.usteed == (monst *)0x0) {
    if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
         ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
       (((youmonst.data)->mflags1 & 1) == 0)) {
      pcVar5 = body_part(5);
      pcVar5 = makeplural(pcVar5);
      __format = "under your %s";
      goto LAB_001aa9e9;
    }
    builtin_strncpy(local_138,"beneath you",0xc);
  }
  else {
    pcVar5 = y_monnam(u.usteed);
    __format = "beneath %s";
LAB_001aa9e9:
    sprintf(local_138,__format,pcVar5);
  }
  pline("You feel a %s %s.",pcVar6,local_138);
  xVar2 = u.uy;
  xVar1 = u.ux;
  bVar3 = Invocation_lev(&u.uz);
  if ((obj == (obj *)0x0 || bVar3 == '\0') || (xVar2 != inv_pos.y || xVar1 != inv_pos.x)) {
    return;
  }
  if (obj->spe != '\a') {
    return;
  }
  if ((obj->field_0x4c & 8) == 0) {
    return;
  }
  pcVar5 = xname(obj);
  pcVar5 = The(pcVar5);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        pcVar6 = "glows with a strange light";
        goto LAB_001aab49;
      }
      goto LAB_001aaaaa;
    }
  }
  else {
LAB_001aaaaa:
    if (ublindf == (obj *)0x0) {
      pcVar6 = "throbs palpably";
      goto LAB_001aab49;
    }
  }
  pcVar6 = "throbs palpably";
  if (ublindf->oartifact == '\x1d') {
    pcVar6 = "glows with a strange light";
  }
LAB_001aab49:
  pline("%s %s!",pcVar5,pcVar6);
  return;
}

Assistant:

void invocation_message(void)
{
	/* a special clue-msg when near the Invocation position */
	if (Invocation_lev(&u.uz)) {
	    const char *strange_vibration;
	    int dist_invocation_pos = distu(inv_pos.x, inv_pos.y);

	    /* different message depending on the distance to the vibrating square
	       ..f..
	       .www.
	       fwswf
	       .www.
	       ..f..
	     */
	    if (dist_invocation_pos == 0)
		strange_vibration = "strange vibration";
	    else if (dist_invocation_pos <= 2)
		strange_vibration = "weak trembling";
	    else
		strange_vibration = "faint trembling";

	    /* within close proximity of the vibrating square */
	    if (dist_invocation_pos <= 4 && !On_stairs(inv_pos.x, inv_pos.y)) {
		char buf[BUFSZ];
		struct obj *otmp = carrying(CANDELABRUM_OF_INVOCATION);

		nomul(0, NULL);		/* stop running or travelling */

		if (u.usteed)
		    sprintf(buf, "beneath %s", y_monnam(u.usteed));
		else if (Levitation || Flying)
		    strcpy(buf, "beneath you");
		else
		    sprintf(buf, "under your %s", makeplural(body_part(FOOT)));
		pline("You feel a %s %s.", strange_vibration, buf);

		/* only report if on the vibrating square */
		if (invocation_pos(&u.uz, u.ux, u.uy) &&
		    otmp && otmp->spe == 7 && otmp->lamplit) {
		    pline("%s %s!", The(xname(otmp)),
			Blind ? "throbs palpably" : "glows with a strange light");
		}
	    }
	}
}